

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

size_t NodeSize(nodeclass *Class)

{
  size_t sVar1;
  uintptr_t *puVar2;
  
  sVar1 = 0x58;
  if ((*(int *)&Class[1].Meta != 0x444f4d4e) && (sVar1 = 0, Class != (nodeclass *)0x0)) {
    do {
      if (Class->Meta != (nodemeta *)0x0) {
        for (puVar2 = &Class->Meta->Data; *(char *)(puVar2 + -1) != '\0'; puVar2 = puVar2 + 2) {
          if (*(char *)(puVar2 + -1) == '\n') {
            sVar1 = *puVar2;
            break;
          }
        }
      }
      Class = Class->ParentClass;
    } while ((Class != (nodeclass *)0x0) && (sVar1 == 0));
  }
  return sVar1;
}

Assistant:

static NOINLINE size_t NodeSize(const nodeclass* Class)
{
    const nodeclass *j;
    const nodemeta* m;
    size_t Size = 0;

    if (NodeClass_ClassId(Class) == NODEMODULE_CLASS)
        return sizeof(nodemodule); // for NodeContext_Done when all classes are already released

    for (j=Class;j && !Size;j=j->ParentClass)
        for (m=j->Meta;m && m->Meta != META_CLASS_PARENT_ID;++m)
            if (m->Meta == META_CLASS_SIZE)
            {
                Size = (size_t)m->Data;
                break;
            }

    return Size;
}